

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O3

void __thiscall jbcoin::openssl::secp256k1_data::secp256k1_data(secp256k1_data *this)

{
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  EC_GROUP *pEVar3;
  BN_CTX *c;
  bn_ctx ctx;
  bignum local_40;
  string local_38;
  
  pBVar2 = BN_new();
  (this->order).ptr = (BIGNUM *)pBVar2;
  if (pBVar2 == (BIGNUM *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"BN_new() failed");
  }
  pEVar3 = EC_GROUP_new_by_curve_name(0x2ca);
  this->group = (EC_GROUP *)pEVar3;
  if (pEVar3 != (EC_GROUP *)0x0) {
    c = BN_CTX_new();
    local_38._M_dataplus._M_p = (pointer)c;
    if (c != (BN_CTX *)0x0) {
      get_order((openssl *)&local_40,this->group,(bn_ctx *)&local_38);
      pBVar1 = (this->order).ptr;
      (this->order).ptr = local_40.ptr;
      local_40.ptr = pBVar1;
      bignum::~bignum(&local_40);
      BN_CTX_free(c);
      return;
    }
    Throw<std::runtime_error,char_const(&)[20]>((char (*) [20])"BN_CTX_new() failed");
  }
  std::__cxx11::string::string
            ((string *)&local_38,"The OpenSSL library on this system lacks elliptic curve support.",
             (allocator *)&local_40);
  LogicError(&local_38);
}

Assistant:

secp256k1_data ()
    {
        group = EC_GROUP_new_by_curve_name (NID_secp256k1);

        if (!group)
            LogicError ("The OpenSSL library on this system lacks elliptic curve support.");

        bn_ctx ctx;
        order = get_order (group, ctx);
    }